

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O1

float __thiscall
Imath_3_2::Frustum<float>::worldRadiusExc(Frustum<float> *this,Vec3<float> *p,float radius)

{
  domain_error *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar3 = this->_nearPlane;
  fVar2 = -fVar3;
  fVar1 = fVar2;
  if (fVar2 <= fVar3) {
    fVar1 = fVar3;
  }
  if (fVar1 <= 1.0) {
    fVar3 = p->z;
    if (fVar3 <= -fVar3) {
      fVar3 = -fVar3;
    }
    if (fVar1 * 3.4028235e+38 <= fVar3) {
      this_00 = (domain_error *)__cxa_allocate_exception(0x10);
      std::domain_error::domain_error
                (this_00,"Bad viewing frustum: near clipping plane is too close to zero");
      __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
    }
  }
  return (p->z / fVar2) * radius;
}

Assistant:

IMATH_CONSTEXPR14 T
Frustum<T>::worldRadiusExc (const Vec3<T>& p, T radius) const
{
    if (abs (-_nearPlane) > T (1) ||
        abs (p.z) < std::numeric_limits<T>::max () * abs (-_nearPlane))
    {
        return radius * (p.z / -_nearPlane);
    }
    else
    {
        throw std::domain_error ("Bad viewing frustum: "
                                 "near clipping plane is too close to zero");
    }
}